

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::TableArena::RollbackTo(TableArena *this,size_t checkpoint)

{
  Block *pBVar1;
  bool bVar2;
  LogMessage *other;
  reference pvVar3;
  char *pcVar4;
  size_t sVar5;
  iterator ppBVar6;
  Block *b_1;
  Block *list;
  iterator __end3;
  iterator __begin3;
  array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *__range3;
  undefined1 local_c0 [8];
  array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> lists;
  Block *b;
  value_type *info;
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  size_t checkpoint_local;
  TableArena *this_local;
  
  local_18 = checkpoint;
  checkpoint_local = (size_t)this;
  while (local_18 < this->num_allocations_) {
    bVar2 = std::
            vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
            ::empty(&this->rollback_info_);
    local_51 = 0;
    if (bVar2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x303);
      local_51 = 1;
      other = internal::LogMessage::operator<<(&local_50,"CHECK failed: !rollback_info_.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&info + 3),other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    pvVar3 = std::
             vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
             ::back(&this->rollback_info_);
    pBVar1 = pvVar3->block;
    pcVar4 = Block::data(pBVar1);
    (anonymous_namespace)::TableArena::
    VisitAlloc<google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>
              (pcVar4,pBVar1,&pBVar1->end_offset);
    sVar5 = pvVar3->count - 1;
    pvVar3->count = sVar5;
    if (sVar5 == 0) {
      std::
      vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
      ::pop_back(&this->rollback_info_);
    }
    this->num_allocations_ = this->num_allocations_ - 1;
  }
  GetLists((array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)local_c0,this
          );
  this->full_blocks_ = (Block *)0x0;
  this->current_ = (Block *)0x0;
  __range3 = (array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)0x0;
  std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_6UL>::fill
            (&this->small_size_blocks_,(value_type *)&__range3);
  __end3 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL>::begin
                     ((array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)
                      local_c0);
  ppBVar6 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL>::end
                      ((array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_8UL> *)
                       local_c0);
  for (; __end3 != ppBVar6; __end3 = __end3 + 1) {
    b_1 = *__end3;
    while (b_1 != (Block *)0x0) {
      pBVar1 = b_1->next;
      if (b_1->start_offset == 0) {
        Block::Destroy(b_1);
        b_1 = pBVar1;
      }
      else {
        RelocateToUsedList(this,b_1);
        b_1 = pBVar1;
      }
    }
  }
  return;
}

Assistant:

void RollbackTo(size_t checkpoint) {
    while (num_allocations_ > checkpoint) {
      GOOGLE_DCHECK(!rollback_info_.empty());
      auto& info = rollback_info_.back();
      Block* b = info.block;

      VisitAlloc(b->data(), &b->start_offset, &b->end_offset, DestroyVisitor{},
                 KnownTypes{});
      if (--info.count == 0) {
        rollback_info_.pop_back();
      }
      --num_allocations_;
    }

    // Reconstruct the lists and destroy empty blocks.
    auto lists = GetLists();
    current_ = full_blocks_ = nullptr;
    small_size_blocks_.fill(nullptr);

    for (Block* list : lists) {
      while (list != nullptr) {
        Block* b = list;
        list = list->next;

        if (b->start_offset == 0) {
          // This is empty, free it.
          b->Destroy();
        } else {
          RelocateToUsedList(b);
        }
      }
    }
  }